

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::CountBitsFunction::~CountBitsFunction(CountBitsFunction *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

CountBitsFunction() : SystemSubroutine(KnownSystemName::CountBits, SubroutineKind::Function) {}